

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O0

int do_listen(s_SocketStuff *s)

{
  int iVar1;
  int *piVar2;
  undefined1 local_128 [8];
  char errorBuffer [256];
  int port_error;
  int listen_error;
  int ret_val;
  s_SocketStuff *s_local;
  
  iVar1 = listen(s->fd,0x1000);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    __xpg_strerror_r(*piVar2,local_128,0x100);
    UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x39d,
               "do_listen(): Error in IPv%d listen(): %s\n",(ulong)(uint)s->ip_version,local_128);
    port_error = -0xce;
  }
  else {
    errorBuffer._252_4_ = get_port(s->fd,&s->actual_port);
    if (-1 < (int)errorBuffer._252_4_) {
      return 0;
    }
    UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x3a9,
               "do_listen(): Error in get_port().\n");
    port_error = -0x38f;
  }
  return port_error;
}

Assistant:

static int do_listen(struct s_SocketStuff *s)
{
	int ret_val;
	int listen_error;
	int port_error;
	char errorBuffer[ERROR_BUFFER_LEN];

	listen_error = listen(s->fd, SOMAXCONN);
	if (listen_error == SOCKET_ERROR) {
		strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
		UpnpPrintf(UPNP_INFO,
			MSERV,
			__FILE__,
			__LINE__,
			"do_listen(): Error in IPv%d listen(): %s\n",
			s->ip_version,
			errorBuffer);
		ret_val = UPNP_E_LISTEN;
		goto error;
	}
	port_error = get_port(s->fd, &s->actual_port);
	if (port_error < 0) {
		UpnpPrintf(UPNP_INFO,
			MSERV,
			__FILE__,
			__LINE__,
			"do_listen(): Error in get_port().\n");
		ret_val = UPNP_E_INTERNAL_ERROR;
		goto error;
	}

	return UPNP_E_SUCCESS;

error:
	return ret_val;
}